

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableSet(SharedValidator *this,Location *loc,Var *table_var)

{
  Result rhs;
  Var local_a0;
  Enum local_54;
  undefined1 local_50 [8];
  TableType table_type;
  Var *table_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&table_type.limits.field_0x14,TableSet);
  this_local._4_4_ = CheckInstr(this,(Opcode)table_type.limits._20_4_,loc);
  TableType::TableType((TableType *)local_50);
  Var::Var(&local_a0,table_var);
  local_54 = (Enum)CheckTableIndex(this,&local_a0,(TableType *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_54);
  Var::~Var(&local_a0);
  rhs = TypeChecker::OnTableSet(&this->typechecker_,(Type)local_50,(Limits *)&table_type);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableSet(const Location& loc, Var table_var) {
  Result result = CheckInstr(Opcode::TableSet, loc);
  TableType table_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= typechecker_.OnTableSet(table_type.element, table_type.limits);
  return result;
}